

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O2

void __thiscall Graph::readQualities(Graph *this)

{
  long *plVar1;
  long lVar2;
  int num;
  string quality;
  stringstream ss;
  fstream file;
  byte abStack_220 [496];
  
  std::fstream::fstream(&file,"qualities.qual",_S_in);
  quality._M_dataplus._M_p = (pointer)&quality.field_2;
  quality._M_string_length = 0;
  quality.field_2._M_local_buf[0] = '\0';
  lVar2 = -1;
  while ((abStack_220[*(long *)(_file + -0x18)] & 2) == 0) {
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&file,(string *)&quality);
    if (*quality._M_dataplus._M_p == '>') {
      _ss = 0;
      std::
      vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
      ::emplace_back<std::vector<int,std::allocator<int>>>
                ((vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
                  *)&this->qualities,(vector<int,_std::allocator<int>_> *)&ss);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)&ss);
      lVar2 = lVar2 + 1;
    }
    else {
      std::__cxx11::stringstream::stringstream((stringstream *)&ss,(string *)&quality,_S_out|_S_in);
      while (plVar1 = (long *)std::istream::operator>>((istream *)&ss,&num),
            (*(byte *)((long)plVar1 + *(long *)(*plVar1 + -0x18) + 0x20) & 5) == 0) {
        std::vector<int,_std::allocator<int>_>::push_back
                  ((this->qualities).
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + lVar2,&num);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
    }
  }
  std::__cxx11::string::~string((string *)&quality);
  std::fstream::~fstream(&file);
  return;
}

Assistant:

void Graph::readQualities(){
    fstream file("qualities.qual", ios::in);
    string quality;
    int row = -1;
    while(!file.eof()){
        getline(file, quality);
        if(quality[0] == '>'){
            this->qualities.emplace_back(vector<int>());
            row++;
            continue;
        }else{
            stringstream ss(quality);
            int num;
            while(ss >> num){
                this->qualities[row].push_back(num);
            }
        }
    }
}